

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O1

int compare2u(void *a,void *b)

{
  uint uVar1;
  
  uVar1 = 0xffffffff;
  if ((*b <= *a) && (uVar1 = 1, *a <= *b)) {
    uVar1 = 0xffffffff;
    if (*(uint *)((long)b + 4) <= *(uint *)((long)a + 4)) {
      uVar1 = (uint)(*(uint *)((long)b + 4) < *(uint *)((long)a + 4));
    }
  }
  return uVar1;
}

Assistant:

static int compare2u(const void* a, const void*b)
{
  unsigned int x = ((const unsigned int*)a)[0];
  unsigned int y = ((const unsigned int*)b)[0];
  if ( x < y)
    return -1;
  if ( x > y)
    return 1;
  x = ((const unsigned int*)a)[1];
  y = ((const unsigned int*)b)[1];
  if ( x < y)
    return -1;
  if ( x > y)
    return 1;
  return 0;
}